

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string_view a,string_view b)

{
  __type _Var1;
  bool bVar2;
  NameEquality NVar3;
  string_view s;
  string_view s_00;
  string local_70;
  string local_50;
  char *pcVar4;
  
  s._M_str = b._M_str;
  s._M_len = (size_t)a._M_str;
  pcVar4 = s._M_str;
  absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_70,(lts_20250127 *)a._M_len,s);
  s_00._M_str = pcVar4;
  s_00._M_len = (size_t)s._M_str;
  absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_50,(lts_20250127 *)b._M_len,s_00);
  _Var1 = std::operator==(&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  NVar3 = NO_MATCH;
  if (_Var1) {
    bVar2 = std::operator==(a,b);
    NVar3 = EQUAL_IGNORE_CASE - bVar2;
  }
  return NVar3;
}

Assistant:

NameEquality CheckNameEquality(absl::string_view a, absl::string_view b) {
  if (absl::AsciiStrToUpper(a) == absl::AsciiStrToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}